

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_tga(char *filename,int x,int y,int comp,void *data)

{
  int iVar1;
  undefined1 local_40 [4];
  int r;
  stbi__write_context s;
  void *data_local;
  int comp_local;
  int y_local;
  int x_local;
  char *filename_local;
  
  s.context = data;
  iVar1 = stbi__start_write_file((stbi__write_context *)local_40,filename);
  if (iVar1 == 0) {
    filename_local._4_4_ = 0;
  }
  else {
    filename_local._4_4_ = stbi_write_tga_core((stbi__write_context *)local_40,x,y,comp,s.context);
    stbi__end_write_file((stbi__write_context *)local_40);
  }
  return filename_local._4_4_;
}

Assistant:

STBIWDEF int stbi_write_tga(char const *filename, int x, int y, int comp, const void *data)
{
   stbi__write_context s;
   if (stbi__start_write_file(&s,filename)) {
      int r = stbi_write_tga_core(&s, x, y, comp, (void *) data);
      stbi__end_write_file(&s);
      return r;
   } else
      return 0;
}